

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O2

char * getenv(char *__name)

{
  bool bVar1;
  stCoRoutine_t *psVar2;
  stCoSysEnvArr_t *psVar3;
  void *pvVar4;
  char *pcVar5;
  stCoSysEnvArr_t *arr;
  stCoSysEnv_t name;
  
  arr = (stCoSysEnvArr_t *)__name;
  if (g_sys_getenv_func == (getenv_pfn_t)0x0) {
    arr = (stCoSysEnvArr_t *)0xffffffffffffffff;
    g_sys_getenv_func = (getenv_pfn_t)dlsym(0xffffffffffffffff,"getenv");
  }
  bVar1 = co_is_enable_sys_hook();
  if (bVar1 && _ZL11g_co_sysenv_0 != 0) {
    psVar2 = co_self();
    name.value = (char *)0x0;
    psVar3 = (stCoSysEnvArr_t *)psVar2->pvEnv;
    name.name = __name;
    if (psVar3 == (stCoSysEnvArr_t *)0x0) {
      psVar3 = dup_co_sysenv_arr(arr);
      psVar2->pvEnv = psVar3;
    }
    pvVar4 = bsearch(&name,psVar3->data,psVar3->cnt,0x10,co_sysenv_comp);
    if (pvVar4 != (void *)0x0) {
      return *(char **)((long)pvVar4 + 8);
    }
  }
  pcVar5 = (*g_sys_getenv_func)(__name);
  return pcVar5;
}

Assistant:

char *getenv( const char *n )
{
	HOOK_SYS_FUNC( getenv )
	if( co_is_enable_sys_hook() && g_co_sysenv.data )
	{
		stCoRoutine_t *self = co_self();

		stCoSysEnv_t name = { (char*)n,0 };

		if( !self->pvEnv )
		{
			self->pvEnv = dup_co_sysenv_arr( &g_co_sysenv );
		}
		stCoSysEnvArr_t *arr = (stCoSysEnvArr_t*)(self->pvEnv);

		stCoSysEnv_t *e = (stCoSysEnv_t*)bsearch( &name,arr->data,arr->cnt,sizeof(name),co_sysenv_comp );

		if( e )
		{
			return e->value;
		}

	}
	return g_sys_getenv_func( n );

}